

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  ulong uVar1;
  bool bVar2;
  TextAttributes *this_00;
  unsigned_long *puVar3;
  size_t sVar4;
  string *psVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  long in_RCX;
  size_t in_RDX;
  ostream *in_RSI;
  string usageCol;
  size_t i;
  Text desc;
  Text usage;
  size_t maxWidth;
  const_iterator it;
  const_iterator itEnd;
  const_iterator itBegin;
  vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  *in_stack_fffffffffffffd68;
  Text *in_stack_fffffffffffffd70;
  allocator local_1e9;
  string local_1e8 [38];
  byte local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  size_t local_1a0;
  size_t local_198;
  ulong local_190;
  TextAttributes local_188 [3];
  TextAttributes *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  Text *in_stack_fffffffffffffef0;
  TextAttributes local_100;
  string local_e0 [24];
  Arg *in_stack_ffffffffffffff38;
  string local_68 [32];
  unsigned_long local_48;
  unsigned_long local_40;
  __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  local_38;
  Arg *local_30;
  Arg *local_28;
  long local_20;
  size_t local_18;
  ostream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (Arg *)std::
                    vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                    ::begin(in_stack_fffffffffffffd68);
  local_30 = (Arg *)std::
                    vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                    ::end(in_stack_fffffffffffffd68);
  __gnu_cxx::
  __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::__normal_iterator(&local_38);
  local_40 = 0;
  local_38._M_current = local_28;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd68), bVar2) {
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->(&local_38);
    Arg::commands_abi_cxx11_(in_stack_ffffffffffffff38);
    local_48 = std::__cxx11::string::size();
    puVar3 = std::max<unsigned_long>(&local_40,&local_48);
    local_40 = *puVar3;
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++(&local_38);
  }
  local_38._M_current = local_28;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd68), bVar2) {
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->(&local_38);
    Arg::commands_abi_cxx11_(in_stack_ffffffffffffff38);
    Catch::TextAttributes::TextAttributes(&local_100);
    this_00 = Catch::TextAttributes::setWidth(&local_100,local_40 + local_18);
    Catch::TextAttributes::setIndent(this_00,local_18);
    Catch::Text::Text(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
    ;
    std::__cxx11::string::~string(local_e0);
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->(&local_38);
    Catch::TextAttributes::TextAttributes(local_188);
    Catch::TextAttributes::setWidth(local_188,(local_20 - local_40) - 3);
    Catch::Text::Text(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
    ;
    local_190 = 0;
    while( true ) {
      uVar6 = local_190;
      local_198 = Catch::Text::size((Text *)0x199d31);
      local_1a0 = Catch::Text::size((Text *)0x199d58);
      puVar3 = std::max<unsigned_long>(&local_198,&local_1a0);
      uVar1 = local_190;
      if (*puVar3 <= uVar6) break;
      local_1c2 = 0;
      sVar4 = Catch::Text::size((Text *)0x199db4);
      if (uVar1 < sVar4) {
        psVar5 = Catch::Text::operator[][abi_cxx11_
                           (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        std::__cxx11::string::string(local_1c0,(string *)psVar5);
      }
      else {
        std::allocator<char>::allocator();
        local_1c2 = 1;
        std::__cxx11::string::string(local_1c0,"",&local_1c1);
      }
      if ((local_1c2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      }
      std::operator<<(local_10,local_1c0);
      uVar6 = local_190;
      sVar4 = Catch::Text::size((Text *)0x199e7d);
      if (uVar6 < sVar4) {
        Catch::Text::operator[][abi_cxx11_
                  (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        uVar6 = std::__cxx11::string::empty();
        poVar9 = local_10;
        if ((uVar6 & 1) == 0) {
          lVar7 = local_18 + local_40;
          lVar8 = std::__cxx11::string::size();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e8,(lVar7 - lVar8) + 2,' ',&local_1e9);
          poVar9 = std::operator<<(poVar9,local_1e8);
          in_stack_fffffffffffffd70 =
               (Text *)Catch::Text::operator[][abi_cxx11_
                                 (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
          std::operator<<(poVar9,(string *)in_stack_fffffffffffffd70);
          std::__cxx11::string::~string(local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
      }
      std::operator<<(local_10,"\n");
      std::__cxx11::string::~string(local_1c0);
      local_190 = local_190 + 1;
    }
    Catch::Text::~Text(in_stack_fffffffffffffd70);
    Catch::Text::~Text(in_stack_fffffffffffffd70);
    __gnu_cxx::
    __normal_iterator<const_Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = CATCH_CONFIG_CONSOLE_WIDTH ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Catch::Text usage( it->commands(), Catch::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                // !TBD handle longer usage strings
                Catch::Text desc( it->description, Catch::TextAttributes()
                                                        .setWidth( width - maxWidth -3 ) );

                for( std::size_t i = 0; i < (std::max)( usage.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usage.size() ? usage[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }